

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

XMLNode * XMLSearch_next(XMLNode *from,XMLSearch *search)

{
  long lVar1;
  int iVar2;
  XMLNode *pXVar3;
  XMLNode *local_28;
  XMLNode *node;
  XMLSearch *search_local;
  XMLNode *from_local;
  
  if ((search != (XMLSearch *)0x0) && (node = (XMLNode *)search, from != (XMLNode *)0x0)) {
    for (; node->father != (_XMLNode *)0x0; node = node->father) {
    }
    lVar1._0_4_ = node->n_children;
    lVar1._4_4_ = node->tag_type;
    if (lVar1 == -1) {
      pXVar3 = XMLNode_next_sibling(from);
      *(XMLNode **)&node->n_children = pXVar3;
    }
    for (local_28 = XMLNode_next(from); local_28 != *(XMLNode **)&node->n_children;
        local_28 = XMLNode_next(local_28)) {
      iVar2 = XMLSearch_node_matches(local_28,(XMLSearch *)node);
      if (iVar2 != 0) {
        if (node->father != (_XMLNode *)0x0) {
          pXVar3 = XMLSearch_next(local_28,(XMLSearch *)node->father);
          return pXVar3;
        }
        return local_28;
      }
    }
  }
  return (XMLNode *)0x0;
}

Assistant:

XMLNode* XMLSearch_next(const XMLNode* from, XMLSearch* search)
{
	XMLNode* node;

	if (search == NULL || from == NULL)
		return NULL;

	/* Go down the last child search as fathers will be tested recursively by the 'XMLSearch_node_matches' function */
	for (; search->next != NULL; search = search->next) ;

	/* Initialize the 'stop_at' node on first search, to remember where to stop as there will be multiple calls */
	/* 'stop_at' can be NULL when 'from' is a root node, that is why it should be initialized with something else than NULL */
	if (search->stop_at == INVALID_XMLNODE_POINTER)
		search->stop_at = XMLNode_next_sibling(from);

	for (node = XMLNode_next(from); node != search->stop_at; node = XMLNode_next(node)) { /* && node != NULL */
		if (!XMLSearch_node_matches(node, search))
			continue;

		/* 'node' is a matching node */

		/* No search to perform on 'node' children => 'node' is returned */
		if (search->next == NULL)
			return node;

		/* Run the search on 'node' children */
		return XMLSearch_next(node, search->next);
	}

	return NULL;
}